

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3Fts5Init(sqlite3 *db)

{
  int iVar1;
  undefined8 *pAux;
  long lVar2;
  ulong uVar3;
  void *p;
  undefined **ppuVar4;
  undefined8 *puVar5;
  undefined1 *puVar6;
  byte bVar7;
  BuiltinTokenizer aBuiltin [3];
  undefined8 local_88;
  undefined1 local_80 [96];
  
  bVar7 = 0;
  iVar1 = sqlite3_initialize();
  if (iVar1 == 0) {
    pAux = (undefined8 *)sqlite3Malloc(0x50);
  }
  else {
    pAux = (undefined8 *)0x0;
  }
  if (pAux == (undefined8 *)0x0) {
    iVar1 = 7;
  }
  else {
    pAux[4] = 0;
    pAux[5] = 0;
    *pAux = 0;
    pAux[1] = 0;
    pAux[2] = 0;
    pAux[3] = 0;
    pAux[8] = 0;
    pAux[9] = 0;
    pAux[6] = 0;
    pAux[7] = 0;
    pAux[4] = db;
    *(undefined4 *)pAux = 2;
    pAux[3] = fts5CreateAux;
    pAux[1] = fts5CreateTokenizer;
    pAux[2] = fts5FindTokenizer;
    iVar1 = createModule(db,"fts5",(sqlite3_module *)fts5Init_fts5Mod,pAux,fts5ModuleDestroy);
    if (iVar1 == 0) {
      iVar1 = createFunctionApi(db,"fts5_decode",2,1,(void *)0x0,fts5DecodeFunction,
                                (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0,
                                (_func_void_sqlite3_context_ptr *)0x0,
                                (_func_void_sqlite3_context_ptr *)0x0,
                                (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0,
                                (_func_void_void_ptr *)0x0);
      if (iVar1 == 0) {
        iVar1 = createFunctionApi(db,"fts5_decode_none",2,1,db,fts5DecodeFunction,
                                  (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0,
                                  (_func_void_sqlite3_context_ptr *)0x0,
                                  (_func_void_sqlite3_context_ptr *)0x0,
                                  (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0,
                                  (_func_void_void_ptr *)0x0);
      }
      if (iVar1 == 0) {
        iVar1 = createFunctionApi(db,"fts5_rowid",-1,1,(void *)0x0,fts5RowidFunction,
                                  (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0,
                                  (_func_void_sqlite3_context_ptr *)0x0,
                                  (_func_void_sqlite3_context_ptr *)0x0,
                                  (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0,
                                  (_func_void_void_ptr *)0x0);
      }
    }
    if (iVar1 == 0) {
      ppuVar4 = &PTR_fts5ExprFunctionHr_00211b88;
      uVar3 = 0;
      do {
        iVar1 = createFunctionApi(db,ppuVar4[-1],-1,1,pAux,
                                  (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)
                                  *ppuVar4,(_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr
                                            *)0x0,(_func_void_sqlite3_context_ptr *)0x0,
                                  (_func_void_sqlite3_context_ptr *)0x0,
                                  (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0,
                                  (_func_void_void_ptr *)0x0);
        if (2 < uVar3) break;
        uVar3 = uVar3 + 1;
        ppuVar4 = ppuVar4 + 2;
      } while (iVar1 == 0);
    }
    if (iVar1 == 0) {
      puVar5 = &DAT_00211bd8;
      uVar3 = 0;
      do {
        iVar1 = (*(code *)pAux[3])(pAux,puVar5[-3],puVar5[-2],puVar5[-1]);
        if (1 < uVar3) break;
        uVar3 = uVar3 + 1;
        puVar5 = puVar5 + 4;
      } while (iVar1 == 0);
    }
    if (iVar1 == 0) {
      ppuVar4 = &PTR_anon_var_dwarf_e5c2e_00211c20;
      puVar5 = &local_88;
      for (lVar2 = 0xc; lVar2 != 0; lVar2 = lVar2 + -1) {
        *puVar5 = *ppuVar4;
        ppuVar4 = ppuVar4 + (ulong)bVar7 * -2 + 1;
        puVar5 = puVar5 + (ulong)bVar7 * -2 + 1;
      }
      puVar6 = local_80;
      uVar3 = 0;
      do {
        iVar1 = (*(code *)pAux[1])(pAux,*(undefined8 *)(puVar6 + -8),pAux,puVar6);
        if (1 < uVar3) break;
        uVar3 = uVar3 + 1;
        puVar6 = puVar6 + 0x20;
      } while (iVar1 == 0);
    }
    if (iVar1 == 0) {
      iVar1 = createModule(db,"fts5vocab",(sqlite3_module *)sqlite3Fts5VocabInit_fts5Vocab,pAux,
                           (_func_void_void_ptr *)0x0);
    }
    if (iVar1 == 0) {
      iVar1 = createFunctionApi(db,"fts5",1,1,pAux,fts5Fts5Func,
                                (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0,
                                (_func_void_sqlite3_context_ptr *)0x0,
                                (_func_void_sqlite3_context_ptr *)0x0,
                                (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0,
                                (_func_void_void_ptr *)0x0);
    }
    if (iVar1 == 0) {
      iVar1 = createFunctionApi(db,"fts5_source_id",0,1,pAux,fts5SourceIdFunc,
                                (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0,
                                (_func_void_sqlite3_context_ptr *)0x0,
                                (_func_void_sqlite3_context_ptr *)0x0,
                                (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0,
                                (_func_void_void_ptr *)0x0);
    }
  }
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3Fts5Init(sqlite3 *db){
  return fts5Init(db);
}